

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O2

int __thiscall
QFileSelector::select
          (QFileSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  QObject *pQVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  undefined1 local_b8 [40];
  QObject *pQStack_90;
  QObject *local_88;
  undefined1 local_78 [16];
  QObject *pQStack_68;
  QObject *local_60;
  QObject *local_58;
  QObject *pQStack_50;
  QObject *local_48;
  QBindingStorageData *local_38;
  
  local_38 = *(QBindingStorageData **)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(CONCAT44(in_register_00000034,__nfds) + 8);
  QUrl::scheme((QString *)local_78,(QUrl *)__readfds);
  bVar7 = isLocalScheme((QString *)local_78);
  if (bVar7) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  }
  else {
    bVar7 = QUrl::isLocalFile((QUrl *)__readfds);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    if (!bVar7) {
      QUrl::QUrl((QUrl *)this,(QUrl *)__readfds);
      goto LAB_00224a57;
    }
  }
  (this->super_QObject)._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl((QUrl *)this,(QUrl *)__readfds);
  QUrl::scheme((QString *)local_78,(QUrl *)__readfds);
  bVar7 = isLocalScheme((QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  iVar8 = (int)uVar1;
  if (bVar7) {
    local_b8._0_8_ = (Data *)0x1;
    local_b8._8_8_ = ":";
    local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::path((QString *)(local_b8 + 0x20),(QUrl *)__readfds,(ComponentFormattingOptions)0x7f00000)
    ;
    local_60 = local_88;
    pQStack_68 = pQStack_90;
    local_78._8_8_ = local_b8._32_8_;
    local_b8._32_8_ = (QObject *)0x0;
    pQStack_90 = (QObject *)0x0;
    local_88 = (QObject *)0x0;
    local_78._0_8_ = (QLatin1String *)local_b8;
    QStringBuilder<QLatin1String_&,_QString>::convertTo<QString>
              ((QString *)&stack0xffffffffffffffa8,
               (QStringBuilder<QLatin1String_&,_QString> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_78 + 8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_b8 + 0x20));
    pQStack_68 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSelectorPrivate::select
              ((QFileSelectorPrivate *)local_78,iVar8,(fd_set *)&stack0xffffffffffffffa8,__writefds,
               __exceptfds,__timeout);
    iVar8 = QString::remove((QString *)local_78,(char *)0x0);
    QUrl::setPath((QUrl *)this,(QString *)CONCAT44(extraout_var,iVar8),DecodedMode);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    this_00 = (QArrayDataPointer<char16_t> *)&stack0xffffffffffffffa8;
  }
  else {
    local_78._0_8_ = (QObject *)0x0;
    local_78._8_8_ = (QObject *)0x0;
    pQStack_68 = (QObject *)0x0;
    bVar7 = QUrl::hasFragment((QUrl *)this);
    if (bVar7) {
      QUrl::fragment((QString *)&stack0xffffffffffffffa8,(QUrl *)this,
                     (ComponentFormattingOptions)0x0);
      __writefds = (fd_set *)local_48;
      pQVar4 = pQStack_68;
      uVar3 = local_78._8_8_;
      uVar1 = local_78._0_8_;
      local_78._0_8_ = local_58;
      local_78._8_8_ = pQStack_50;
      local_58 = (QObject *)uVar1;
      pQStack_50 = (QObject *)uVar3;
      pQStack_68 = local_48;
      local_48 = pQVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffa8);
    }
    local_58 = (QObject *)0x0;
    pQStack_50 = (QObject *)0x0;
    local_48 = (QObject *)0x0;
    bVar7 = QUrl::hasQuery((QUrl *)this);
    if (bVar7) {
      QUrl::query((QString *)(local_b8 + 0x20),(QUrl *)this,(ComponentFormattingOptions)0x0);
      pQVar6 = local_48;
      pQVar5 = pQStack_50;
      pQVar4 = local_58;
      __writefds = (fd_set *)local_88;
      local_58 = (QObject *)local_b8._32_8_;
      pQStack_50 = pQStack_90;
      local_b8._32_8_ = pQVar4;
      pQStack_90 = pQVar5;
      local_48 = local_88;
      local_88 = pQVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_b8 + 0x20));
    }
    QUrl::toLocalFile((QString *)local_b8,(QUrl *)this);
    QFileSelectorPrivate::select
              ((QFileSelectorPrivate *)(local_b8 + 0x20),iVar8,(fd_set *)local_b8,__writefds,
               __exceptfds,__timeout);
    QUrl::fromLocalFile((QUrl *)(local_b8 + 0x18),(QString *)(local_b8 + 0x20));
    pp_Var2 = (this->super_QObject)._vptr_QObject;
    (this->super_QObject)._vptr_QObject = (_func_int **)local_b8._24_8_;
    local_b8._24_8_ = pp_Var2;
    QUrl::~QUrl((QUrl *)(local_b8 + 0x18));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_b8 + 0x20));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    if ((QObject *)local_78._8_8_ != (QObject *)0x0) {
      QUrl::setFragment((QUrl *)this,(QString *)local_78,TolerantMode);
    }
    if (pQStack_50 != (QObject *)0x0) {
      QUrl::setQuery((QUrl *)this,(QString *)&stack0xffffffffffffffa8,TolerantMode);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffa8);
    this_00 = (QArrayDataPointer<char16_t> *)local_78;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
LAB_00224a57:
  if (*(QBindingStorageData **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QFileSelector::select(const QUrl &filePath) const
{
    Q_D(const QFileSelector);
    if (!isLocalScheme(filePath.scheme()) && !filePath.isLocalFile())
        return filePath;
    QUrl ret(filePath);
    if (isLocalScheme(filePath.scheme())) {
        auto scheme = ":"_L1;
#ifdef Q_OS_ANDROID
        // use other scheme because ":" means "qrc" here
        if (filePath.scheme() == "assets"_L1)
            scheme = "assets:"_L1;
#endif

        QString equivalentPath = scheme + filePath.path();
        QString selectedPath = d->select(equivalentPath);
        ret.setPath(selectedPath.remove(0, scheme.size()));
    } else {
        // we need to store the original query and fragment, since toLocalFile() will strip it off
        QString frag;
        if (ret.hasFragment())
            frag = ret.fragment();
        QString query;
        if (ret.hasQuery())
            query= ret.query();
        ret = QUrl::fromLocalFile(d->select(ret.toLocalFile()));
        if (!frag.isNull())
            ret.setFragment(frag);
        if (!query.isNull())
            ret.setQuery(query);
    }
    return ret;
}